

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::definePrimitive(Forth *this,char *name,Code code,bool setImmediate)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pDVar3;
  size_t __len2;
  Definition *pDVar4;
  undefined7 in_register_00000009;
  size_type sVar5;
  char cVar6;
  char in_R8B;
  Definition local_78;
  
  local_78._9_7_ = in_register_00000009;
  local_78._8_1_ = setImmediate;
  paVar1 = &local_78.name.field_2;
  local_78.flags = 0;
  local_78.name._M_string_length = 0;
  local_78.name.field_2._M_local_buf[0] = '\0';
  local_78.numberInVector = 0;
  local_78.searchOrder = 0;
  local_78.FlagHidden = 2;
  local_78.FlagImmediate = 4;
  local_78.does = this->dataPointer;
  local_78.code = code;
  local_78.parameter = local_78.does;
  local_78.name._M_dataplus._M_p = (pointer)paVar1;
  __len2 = strlen(name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_78.name,0,0,name,__len2);
  if (local_78.name._M_string_length != 0) {
    sVar5 = 0;
    do {
      cVar2 = local_78.name._M_dataplus._M_p[sVar5];
      cVar6 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar6 = cVar2;
      }
      local_78.name._M_dataplus._M_p[sVar5] = cVar6;
      sVar5 = sVar5 + 1;
    } while (local_78.name._M_string_length != sVar5);
  }
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
  emplace_back<cppforth::Forth::Definition>(&this->definitions,&local_78);
  pDVar4 = getDefinition(this,(int)((ulong)((long)(this->definitions).
                                                  super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->definitions).
                                                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x33333333 - 1);
  pDVar3 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar4->numberInVector =
       (int)((ulong)((long)pDVar3 -
                    (long)(this->definitions).
                          super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 - 1;
  pDVar4->searchOrder = this->searchOrderCurrent;
  if (in_R8B != '\0') {
    pDVar3[-1].flags = pDVar3[-1].flags | pDVar3[-1].FlagImmediate;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.name._M_dataplus._M_p,
                    CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                             local_78.name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void definePrimitive(const char* name, Code code, bool setImmediate) {
			alignDataPointer();

			Definition defn;
			defn.code = code;
			defn.parameter = defn.does = AADDR(getDataPointer());
			defn.name = name;
			for (auto & c: defn.name) c = toupper_ascii(static_cast<unsigned char>(c));
			definitions.emplace_back(std::move(defn));
			auto lastDefinition=getDefinition(CELL(definitions.size()) - 1);
			lastDefinition->numberInVector = CELL(definitions.size()) - 1;
			lastDefinition->searchOrder=searchOrderCurrent;
			if (setImmediate) immediate();
		}